

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialColor(aiMaterial *pMat,char *pKey,uint type,uint index,aiColor4D *pOut)

{
  aiReturn aVar1;
  uint local_2c;
  aiReturn eRet;
  uint iMax;
  aiColor4D *pOut_local;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *pMat_local;
  
  local_2c = 4;
  _eRet = pOut;
  pOut_local._0_4_ = index;
  pOut_local._4_4_ = type;
  _index_local = pKey;
  pKey_local = (char *)pMat;
  aVar1 = aiGetMaterialFloatArray(pMat,pKey,type,index,&pOut->r,&local_2c);
  if (local_2c == 3) {
    _eRet->a = 1.0;
  }
  return aVar1;
}

Assistant:

aiReturn aiGetMaterialColor(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiColor4D* pOut)
{
    unsigned int iMax = 4;
    const aiReturn eRet = aiGetMaterialFloatArray(pMat,pKey,type,index,(ai_real*)pOut,&iMax);

    // if no alpha channel is defined: set it to 1.0
    if (3 == iMax) {
        pOut->a = 1.0;
    }

    return eRet;
}